

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  const_iterator __position;
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  ArrayIndex in_ESI;
  Value *in_RDI;
  value_type defaultValue;
  iterator it;
  CZString key;
  ostringstream oss;
  Value *in_stack_fffffffffffffd68;
  pair<const_Json::Value::CZString,_Json::Value> *__x;
  __enable_if_t<is_constructible<value_type,_pair<const_CZString,_Value>_&>::value,_iterator>
  in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  ValueType in_stack_fffffffffffffd7c;
  ValueType VVar3;
  Value *in_stack_fffffffffffffd80;
  Value *__y;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffd90;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_258;
  _Base_ptr local_250;
  undefined4 local_20c;
  _Self local_208;
  _Self local_200;
  undefined1 local_1f8 [56];
  string local_1c0 [48];
  ostringstream local_190 [380];
  ArrayIndex local_14;
  Value *local_8;
  
  if (((*(ushort *)&in_RDI->field_0x8 & 0xff) != 0) && ((*(ushort *)&in_RDI->field_0x8 & 0xff) != 6)
     ) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,
                    "in Json::Value::operator[](ArrayIndex): requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_1c0);
    abort();
  }
  local_14 = in_ESI;
  if ((*(ushort *)&in_RDI->field_0x8 & 0xff) == 0) {
    in_stack_fffffffffffffd90 = (pair<const_Json::Value::CZString,_Json::Value> *)(local_1f8 + 0x10)
    ;
    Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    operator=((Value *)in_stack_fffffffffffffd70._M_node,in_stack_fffffffffffffd68);
    ~Value(in_RDI);
  }
  __y = (Value *)local_1f8;
  CZString::CZString((CZString *)__y,local_14);
  this_00 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffd68,(key_type *)0x160d73);
  local_200._M_node = this_00._M_node;
  local_208._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffd68);
  bVar1 = std::operator!=(&local_200,&local_208);
  VVar3 = in_stack_fffffffffffffd7c & 0xffffff;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x160dcd);
    bVar1 = CZString::operator==((CZString *)this_00._M_node,(CZString *)__y);
    VVar3 = CONCAT13(bVar1,(int3)VVar3);
  }
  if ((char)(VVar3 >> 0x18) == '\0') {
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              (in_stack_fffffffffffffd90,(CZString *)this_00._M_node,__y);
    __x = (pair<const_Json::Value::CZString,_Json::Value> *)(in_RDI->value_).map_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_258,&local_200);
    __position._M_node._4_4_ = VVar3;
    __position._M_node._0_4_ = in_stack_fffffffffffffd78;
    in_stack_fffffffffffffd70 =
         std::
         map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
         ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                   (in_stack_fffffffffffffd70._M_node,__position,__x);
    local_250 = in_stack_fffffffffffffd70._M_node;
    local_200._M_node = in_stack_fffffffffffffd70._M_node;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x160ea4);
    local_8 = &ppVar2->second;
    local_20c = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair
              ((pair<const_Json::Value::CZString,_Json::Value> *)in_stack_fffffffffffffd70._M_node);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x160df8);
    local_8 = &ppVar2->second;
    local_20c = 1;
  }
  CZString::~CZString((CZString *)in_stack_fffffffffffffd70._M_node);
  return local_8;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  ObjectValues::iterator it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullRef);
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}